

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O2

IShaderResourceVariable * __thiscall
Diligent::ShaderVariableManagerGL::
GetResourceByName<Diligent::ShaderVariableManagerGL::TextureBindInfo>
          (ShaderVariableManagerGL *this,Char *Name)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_00;
  PipelineResourceDesc *pPVar4;
  Uint32 res;
  Uint32 ResIndex;
  
  uVar1 = this->m_ImageOffset;
  uVar2 = this->m_TextureOffset;
  ResIndex = 0;
  do {
    if ((Uint32)(((ulong)uVar1 - (ulong)uVar2) / 0x18) == ResIndex) {
      return (IShaderResourceVariable *)0x0;
    }
    this_00 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
               *)GetResource<Diligent::ShaderVariableManagerGL::TextureBindInfo>(this,ResIndex);
    pPVar4 = ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
             ::GetDesc(this_00);
    iVar3 = strcmp(pPVar4->Name,Name);
    ResIndex = ResIndex + 1;
  } while (iVar3 != 0);
  return &this_00->super_IShaderResourceVariable;
}

Assistant:

IShaderResourceVariable* ShaderVariableManagerGL::GetResourceByName(const Char* Name) const
{
    auto NumResources = GetNumResources<ResourceType>();
    for (Uint32 res = 0; res < NumResources; ++res)
    {
        auto&       Resource = GetResource<ResourceType>(res);
        const auto& ResDesc  = Resource.GetDesc();
        if (strcmp(ResDesc.Name, Name) == 0)
            return &Resource;
    }

    return nullptr;
}